

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O0

int Bmc_CollapseExpandRound
              (sat_solver *pSat,sat_solver *pSatOn,Vec_Int_t *vLits,Vec_Int_t *vNums,
              Vec_Int_t *vTemp,int nBTLimit,int fCanon,int fOnOffSetLit)

{
  int Lit;
  int iVar1;
  int *piVar2;
  int *piVar3;
  int Save;
  abctime clk;
  int status;
  int iLit;
  int n;
  int k;
  int fProfile;
  int nBTLimit_local;
  Vec_Int_t *vTemp_local;
  Vec_Int_t *vNums_local;
  Vec_Int_t *vLits_local;
  sat_solver *pSatOn_local;
  sat_solver *pSat_local;
  
  iLit = Vec_IntSize(vLits);
LAB_006b679f:
  do {
    iLit = iLit + -1;
    if (iLit < 0) {
      return 0;
    }
    Lit = Vec_IntEntry(vLits,iLit);
  } while (Lit == -1);
  if (pSatOn != (sat_solver *)0x0) goto code_r0x006b67ce;
  goto LAB_006b695d;
code_r0x006b67ce:
  if (fOnOffSetLit != -1) {
    __assert_fail("fOnOffSetLit == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                  ,0x174,
                  "int Bmc_CollapseExpandRound(sat_solver *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                 );
  }
  if ((fCanon == 0) || (iVar1 = Abc_LitIsCompl(Lit), iVar1 != 0)) {
    Vec_IntClear(vTemp);
    for (status = 0; iVar1 = Vec_IntSize(vLits), status < iVar1; status = status + 1) {
      iVar1 = Vec_IntEntry(vLits,status);
      if (iVar1 != -1) {
        iVar1 = Abc_LitNotCond(iVar1,(uint)(iLit == status));
        Vec_IntPush(vTemp,iVar1);
      }
    }
    piVar2 = Vec_IntArray(vTemp);
    piVar3 = Vec_IntLimit(vTemp);
    iVar1 = sat_solver_solve(pSatOn,piVar2,piVar3,(long)nBTLimit,0,0,0);
    if (iVar1 == 0) {
      return -1;
    }
    if (iVar1 != -1) {
LAB_006b695d:
      Vec_IntWriteEntry(vLits,iLit,-1);
      Vec_IntClear(vTemp);
      if (-1 < fOnOffSetLit) {
        Vec_IntPush(vTemp,fOnOffSetLit);
      }
      for (status = 0; iVar1 = Vec_IntSize(vLits), status < iVar1; status = status + 1) {
        iVar1 = Vec_IntEntry(vLits,status);
        if (iVar1 != -1) {
          Vec_IntPush(vTemp,iVar1);
        }
      }
      piVar2 = Vec_IntArray(vTemp);
      piVar3 = Vec_IntLimit(vTemp);
      iVar1 = sat_solver_solve(pSat,piVar2,piVar3,(long)nBTLimit,0,0,0);
      if (iVar1 == 0) {
        return -1;
      }
      if (iVar1 == 1) {
        Vec_IntWriteEntry(vLits,iLit,Lit);
      }
    }
  }
  goto LAB_006b679f;
}

Assistant:

int Bmc_CollapseExpandRound( sat_solver * pSat, sat_solver * pSatOn, Vec_Int_t * vLits, Vec_Int_t * vNums, Vec_Int_t * vTemp, int nBTLimit, int fCanon, int fOnOffSetLit )
{
    int fProfile = 0;
    int k, n, iLit, status;
    abctime clk;
    // try removing one literal at a time
    for ( k = Vec_IntSize(vLits) - 1; k >= 0; k-- )
    {
        int Save = Vec_IntEntry( vLits, k );
        if ( Save == -1 )
            continue;
        // check if this literal when expanded overlaps with the on-set
        if ( pSatOn )
        {
            assert( fOnOffSetLit == -1 );
            // it is ok to skip the first round if the literal is positive
            if ( fCanon && !Abc_LitIsCompl(Save) )
                continue;
            // put into new array
            Vec_IntClear( vTemp );
            Vec_IntForEachEntry( vLits, iLit, n )
                if ( iLit != -1 )
                    Vec_IntPush( vTemp, Abc_LitNotCond(iLit, k==n) );
            // check against onset
            if ( fProfile ) clk = Abc_Clock();
            status = sat_solver_solve( pSatOn, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
            if ( fProfile ) clkCheck1 += Abc_Clock() - clk;
            if ( status == l_Undef )
                return -1;
            //printf( "%d", status == l_True );
            if ( status == l_False )
            {
                if ( fProfile ) clkCheckU += Abc_Clock() - clk;
                continue;
            }
            if ( fProfile ) clkCheckS += Abc_Clock() - clk;
            // otherwise keep trying to remove it
        }
        Vec_IntWriteEntry( vLits, k, -1 );
        // put into new array
        Vec_IntClear( vTemp );
        if ( fOnOffSetLit >= 0 )
            Vec_IntPush( vTemp, fOnOffSetLit );
        Vec_IntForEachEntry( vLits, iLit, n )
            if ( iLit != -1 )
                Vec_IntPush( vTemp, iLit );
        // check against offset
        if ( fProfile ) clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
        if ( fProfile ) clkCheck2 += Abc_Clock() - clk;
//        if ( fOnOffSetLit >= 0 )
//            Vec_IntPop( vTemp );
        if ( status == l_Undef )
            return -1;
        if ( status == l_True )
        {
            Vec_IntWriteEntry( vLits, k, Save );
            if ( fProfile ) clkCheckS += Abc_Clock() - clk;
        }
        else
            if ( fProfile ) clkCheckU += Abc_Clock() - clk;
    }
//    if ( pSatOn )
//    printf( "\n" );
    return 0;
}